

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  string *extraout_RAX;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  StringOutputStream *this_00;
  StringOutputStream *pSVar10;
  long *plVar11;
  uint uVar12;
  undefined1 auStack_10b0 [4104];
  StringOutputStream *pSStack_a8;
  long lStack_70;
  code *pcStack_68;
  StringOutputStream SStack_60;
  StringOutputStream local_30;
  
  psVar1 = this->target_;
  if (psVar1 != (string *)0x0) {
    uVar8 = psVar1->_M_string_length;
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(psVar1->_M_dataplus)._M_p != &psVar1->field_2) {
      uVar4 = (psVar1->field_2)._M_allocated_capacity;
    }
    uVar6 = uVar8 * 2;
    if (uVar8 < uVar4) {
      uVar6 = uVar4;
    }
    if (uVar8 + 0x7fffffff < uVar6) {
      uVar6 = uVar8 + 0x7fffffff;
    }
    uVar4 = 0x10;
    if (0x10 < uVar6) {
      uVar4 = uVar6;
    }
    std::__cxx11::string::resize((ulong)psVar1,(char)uVar4);
    *data = (this->target_->_M_dataplus)._M_p + uVar8;
    *size = (int)this->target_->_M_string_length - (int)uVar8;
    return true;
  }
  this_00 = &local_30;
  Next(this_00);
  pSVar10 = &SStack_60;
  iVar9 = (int)data;
  uVar8 = (ulong)data & 0xffffffff;
  if (iVar9 < 0) {
    data = (void **)0x0;
    pcStack_68 = (code *)0x16b7d7;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar9,0,"count >= 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 != (string *)0x0) {
    pcStack_68 = (code *)0x16b7fd;
    BackUp();
    psVar5 = extraout_RAX;
    goto LAB_0016b7fd;
  }
  if (this_00->target_ == (string *)0x0) {
    pcStack_68 = (code *)0x16b7e1;
    BackUp(&SStack_60);
LAB_0016b7e1:
    pcStack_68 = (code *)0x16b7f0;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((ulong)this,(ulong)data,"static_cast<size_t>(count) <= target_->size()");
  }
  else {
    this = (StringOutputStream *)(long)iVar9;
    data = (void **)this_00->target_->_M_string_length;
    if (data < this) goto LAB_0016b7e1;
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    uVar2 = std::__cxx11::string::resize
                      ((ulong)this_00->target_,(char)this_00->target_->_M_string_length - (char)this
                      );
    return (bool)uVar2;
  }
LAB_0016b7fd:
  iVar9 = (int)psVar5;
  pcStack_68 = ByteCount;
  BackUp();
  if (*(long *)((long)pSVar10 + 8) != 0) {
    return SUB81(*(undefined8 *)(*(long *)((long)pSVar10 + 8) + 8),0);
  }
  plVar11 = &lStack_70;
  ByteCount();
  uVar12 = 0;
  pSStack_a8 = this_00;
  do {
    iVar7 = iVar9 - uVar12;
    if (iVar7 == 0 || iVar9 < (int)uVar12) {
      return (bool)(char)uVar12;
    }
    if (0xfff < iVar7) {
      iVar7 = 0x1000;
    }
    iVar3 = (**(code **)(*plVar11 + 0x10))(plVar11,auStack_10b0,iVar7);
    iVar7 = 0;
    if (0 < iVar3) {
      iVar7 = iVar3;
    }
    if (iVar3 < 1) {
      uVar8 = (ulong)uVar12;
    }
    uVar12 = iVar7 + uVar12;
  } while (0 < iVar3);
  return (bool)(char)uVar8;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  ABSL_CHECK(target_ != nullptr);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  absl::strings_internal::STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}